

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_paged_audio_buffer_get_length_in_pcm_frames
                    (ma_paged_audio_buffer *pPagedAudioBuffer,ma_uint64 *pLength)

{
  ma_result mVar1;
  ma_uint64 *pLength_local;
  ma_paged_audio_buffer *pPagedAudioBuffer_local;
  
  mVar1 = ma_paged_audio_buffer_data_get_length_in_pcm_frames(pPagedAudioBuffer->pData,pLength);
  return mVar1;
}

Assistant:

MA_API ma_result ma_paged_audio_buffer_get_length_in_pcm_frames(ma_paged_audio_buffer* pPagedAudioBuffer, ma_uint64* pLength)
{
    return ma_paged_audio_buffer_data_get_length_in_pcm_frames(pPagedAudioBuffer->pData, pLength);
}